

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  int iVar1;
  int local_30;
  int cnt;
  int mxSelect;
  Select *pLoop;
  Select *pNext;
  Select *p_local;
  Parse *pParse_local;
  
  if (p->pPrior != (Select *)0x0) {
    pLoop = (Select *)0x0;
    local_30 = 0;
    for (_cnt = p; _cnt != (Select *)0x0; _cnt = _cnt->pPrior) {
      _cnt->pNext = pLoop;
      _cnt->selFlags = _cnt->selFlags | 0x100;
      pLoop = _cnt;
      local_30 = local_30 + 1;
    }
    if ((((p->selFlags & 0x400) == 0) && (iVar1 = pParse->db->aLimit[4], 0 < iVar1)) &&
       (iVar1 < local_30)) {
      sqlite3ErrorMsg(pParse,"too many terms in compound SELECT");
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    if( p->pPrior ){
      Select *pNext = 0, *pLoop;
      int mxSelect, cnt = 0;
      for(pLoop=p; pLoop; pNext=pLoop, pLoop=pLoop->pPrior, cnt++){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
      }
      if( (p->selFlags & SF_MultiValue)==0 && 
        (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0 &&
        cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }